

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::parse_bson_element_internal
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,char_int_type element_type,size_t element_type_parse_position)

{
  bool bVar1;
  char_int_type cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  size_type __maxlen;
  allocator<char> *__a;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  string cr_str;
  array<char,_3UL> cr;
  int64_t value_3;
  int32_t value_2;
  binary_t value_1;
  int32_t len_1;
  string_t value;
  int32_t len;
  double number;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe38;
  long *plVar3;
  double *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  input_format_t format;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe58;
  array<char,_3UL> *this_00;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator<char> *__s;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  byte local_177;
  byte local_173;
  byte local_151;
  string local_140 [32];
  undefined1 local_120 [47];
  allocator<char> local_f1;
  string local_f0 [36];
  array<char,_3UL> local_cc;
  binary_t *in_stack_ffffffffffffff38;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int iVar5;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  string local_88 [36];
  undefined4 local_64;
  byte local_5d;
  byte local_4a;
  allocator<char> local_49;
  string local_48 [32];
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  byte local_1;
  
  format = (input_format_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  switch(in_ESI) {
  case 1:
    local_28 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<double,true>(in_stack_fffffffffffffe58,format,in_stack_fffffffffffffe48);
    uVar4 = local_28;
    local_4a = 0;
    local_5d = 0;
    local_151 = 0;
    if (bVar1) {
      plVar3 = *(long **)(in_RDI + 0x28);
      std::allocator<char>::allocator();
      local_4a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                 in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      local_5d = 1;
      local_151 = (**(code **)(*plVar3 + 0x20))(uVar4,plVar3,local_48);
    }
    local_1 = local_151 & 1;
    if ((local_5d & 1) != 0) {
      std::__cxx11::string::~string(local_48);
    }
    if ((local_4a & 1) != 0) {
      std::allocator<char>::~allocator(&local_49);
    }
    break;
  case 2:
    local_64 = 0;
    std::__cxx11::string::string(local_88);
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe58,format,(int *)in_stack_fffffffffffffe48);
    local_173 = 0;
    if (bVar1) {
      bVar1 = get_bson_string<int>
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                         (string_t *)in_stack_ffffffffffffff38);
      local_173 = 0;
      if (bVar1) {
        local_173 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                              (*(long **)(in_RDI + 0x28),local_88);
      }
    }
    local_1 = local_173 & 1;
    std::__cxx11::string::~string(local_88);
    break;
  case 3:
    local_1 = parse_bson_internal(in_stack_fffffffffffffe38);
    break;
  case 4:
    local_1 = parse_bson_array(in_stack_fffffffffffffe38);
    break;
  case 5:
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe58,format,(int *)in_stack_fffffffffffffe48);
    local_177 = 0;
    if (bVar1) {
      bVar1 = get_bson_binary<int>
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                         in_stack_ffffffffffffff38);
      local_177 = 0;
      if (bVar1) {
        local_177 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))
                              (*(long **)(in_RDI + 0x28),&stack0xffffffffffffff48);
      }
    }
    local_1 = local_177 & 1;
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x272c0a);
    break;
  default:
    local_cc._M_elems[2] = '\0';
    local_cc._M_elems[0] = '\0';
    local_cc._M_elems[1] = '\0';
    this_00 = &local_cc;
    local_20 = in_RDX;
    local_14 = in_ESI;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::array<char,_3UL>::data((array<char,_3UL> *)0x272d7f);
    __maxlen = std::array<char,_3UL>::size(this_00);
    snprintf((char *)args_1,__maxlen,"%.2hhX",(ulong)(byte)local_14);
    __a = (allocator<char> *)std::array<char,_3UL>::data((array<char,_3UL> *)0x272db6);
    __s = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),(char *)__s,
               __a);
    std::allocator<char>::~allocator(&local_f1);
    plVar3 = *(long **)(in_RDI + 0x28);
    concat<std::__cxx11::string,char_const(&)[32],std::__cxx11::string_const&>
              (this_00->_M_elems,args_1);
    parse_error::create<std::nullptr_t,_0>
              (in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
               (string *)in_stack_ffffffffffffff48,
               (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_1 = (**(code **)(*plVar3 + 0x60))(plVar3,local_20,local_f0,local_120);
    local_1 = local_1 & 1;
    parse_error::~parse_error((parse_error *)0x272e9d);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_f0);
    break;
  case 8:
    plVar3 = *(long **)(in_RDI + 0x28);
    cVar2 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                 *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    local_1 = (**(code **)(*plVar3 + 8))(plVar3,cVar2 != 0);
    local_1 = local_1 & 1;
    break;
  case 10:
    local_1 = (**(code **)**(undefined8 **)(in_RDI + 0x28))();
    local_1 = local_1 & 1;
    break;
  case 0x10:
    iVar5 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,true>
                      (in_stack_fffffffffffffe58,format,(int *)in_stack_fffffffffffffe48);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                          (*(long **)(in_RDI + 0x28),(long)iVar5);
    }
    local_1 = local_1 & 1;
    break;
  case 0x12:
    uVar4 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<long,true>
                      (in_stack_fffffffffffffe58,format,(long *)in_stack_fffffffffffffe48);
    local_1 = 0;
    if (bVar1) {
      local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),uVar4);
    }
    local_1 = local_1 & 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_bson_element_internal(const char_int_type element_type,
                                     const std::size_t element_type_parse_position)
    {
        switch (element_type)
        {
            case 0x01: // double
            {
                double number{};
                return get_number<double, true>(input_format_t::bson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0x02: // string
            {
                std::int32_t len{};
                string_t value;
                return get_number<std::int32_t, true>(input_format_t::bson, len) && get_bson_string(len, value) && sax->string(value);
            }

            case 0x03: // object
            {
                return parse_bson_internal();
            }

            case 0x04: // array
            {
                return parse_bson_array();
            }

            case 0x05: // binary
            {
                std::int32_t len{};
                binary_t value;
                return get_number<std::int32_t, true>(input_format_t::bson, len) && get_bson_binary(len, value) && sax->binary(value);
            }

            case 0x08: // boolean
            {
                return sax->boolean(get() != 0);
            }

            case 0x0A: // null
            {
                return sax->null();
            }

            case 0x10: // int32
            {
                std::int32_t value{};
                return get_number<std::int32_t, true>(input_format_t::bson, value) && sax->number_integer(value);
            }

            case 0x12: // int64
            {
                std::int64_t value{};
                return get_number<std::int64_t, true>(input_format_t::bson, value) && sax->number_integer(value);
            }

            default: // anything else not supported (yet)
            {
                std::array<char, 3> cr{{}};
                static_cast<void>((std::snprintf)(cr.data(), cr.size(), "%.2hhX", static_cast<unsigned char>(element_type))); // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
                const std::string cr_str{cr.data()};
                return sax->parse_error(element_type_parse_position, cr_str,
                                        parse_error::create(114, element_type_parse_position, concat("Unsupported BSON record type 0x", cr_str), nullptr));
            }
        }
    }